

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int&>
          (Fault *this,char *file,char line [7],Type code,char *condition,char *macroArgs,
          StringPtr *params)

{
  undefined1 in_register_00000017;
  char argValues [1] [7];
  Array<char> local_48;
  
  this->exception = (Exception *)0x0;
  str<unsigned_int&>((String *)&local_48,(kj *)params,(uint *)CONCAT17(in_register_00000017,line));
  init(this,(EVP_PKEY_CTX *)file);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}